

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O3

base_uint<256U> * __thiscall base_uint<256U>::operator--(base_uint<256U> *this)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = 0;
  do {
    puVar1 = this->pn + lVar4;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 - 1;
    if (uVar2 != 0) break;
    bVar5 = lVar4 != 7;
    lVar4 = lVar4 + 1;
  } while (bVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator--()
    {
        // prefix operator
        int i = 0;
        while (i < WIDTH && --pn[i] == std::numeric_limits<uint32_t>::max())
            i++;
        return *this;
    }